

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall ThreadData::runInThread(ThreadData *this)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  
  if (*(int *)(in_FS_OFFSET + -0x30) == 0) {
    CurrentThread::cacheTid();
  }
  *this->tid_ = *(pid_t *)(in_FS_OFFSET + -0x30);
  this->tid_ = (pid_t *)0x0;
  CountDownLatch::countDown(this->latch_);
  this->latch_ = (CountDownLatch *)0x0;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  *(pointer *)(in_FS_OFFSET + -0x48) = pcVar1;
  puVar2 = (undefined8 *)&DAT_0000000f;
  prctl(0xf);
  if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->func_)._M_invoker)((_Any_data *)this);
    return;
  }
  std::__throw_bad_function_call();
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  if (*(code **)(pcVar1 + 0x10) != (code *)0x0) {
    (**(code **)(pcVar1 + 0x10))();
    puVar2[3] = *(undefined8 *)(pcVar1 + 0x18);
    puVar2[2] = *(undefined8 *)(pcVar1 + 0x10);
  }
  return;
}

Assistant:

void runInThread() {
        *tid_ = CurrentThread::tid();
        tid_ = NULL;
        latch_->countDown();
        latch_ = NULL;

        CurrentThread::t_threadName = name_.c_str();
        prctl(PR_SET_NAME, CurrentThread::t_threadName);
        func_();
        
    }